

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

void __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::
Object(Object<(anonymous_namespace)::Version> *this,Object<(anonymous_namespace)::Version> *param_1)

{
  pointer pMVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined3 uVar4;
  ReadFileResult RVar5;
  pointer pMVar6;
  pointer pMVar7;
  long lVar8;
  
  lVar8 = (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar6 = std::
           _Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
           ::_M_allocate((_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                          *)((lVar8 >> 3) * 0x6db6db6db6db6db7),(size_t)param_1);
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_start = pMVar6;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar8 + (long)pMVar6);
  pMVar1 = (param_1->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar7 = (param_1->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar1; pMVar7 = pMVar7 + 1) {
    pcVar3 = (pMVar7->Name)._M_str;
    (pMVar6->Name)._M_len = (pMVar7->Name)._M_len;
    (pMVar6->Name)._M_str = pcVar3;
    std::
    function<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*)>
    ::function(&pMVar6->Function,&pMVar7->Function);
    pMVar6->Required = pMVar7->Required;
    pMVar6 = pMVar6 + 1;
  }
  (this->Members).
  super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  uVar4 = *(undefined3 *)&param_1->field_0x19;
  RVar5 = param_1->Success;
  uVar2 = *(undefined8 *)((long)&param_1->Success + 1);
  this->AnyRequired = param_1->AnyRequired;
  *(undefined3 *)&this->field_0x19 = uVar4;
  this->Success = RVar5;
  *(undefined8 *)((long)&this->Success + 1) = uVar2;
  return;
}

Assistant:

Object(E&& success, E&& fail, bool allowExtra = true)
      : Success(std::move(success))
      , Fail(std::move(fail))
      , AllowExtra(allowExtra)
    {
    }